

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O2

void acutest_skip_(char *file,int line,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  args[0].reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x18;
  args[0].fp_offset = 0x30;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  vsnprintf(acutest_test_skip_reason_,0x100,fmt,args);
  acutest_test_skip_reason_[0xff] = '\0';
  sVar1 = strlen(acutest_test_skip_reason_);
  if ((&DAT_001a117f)[sVar1] == '.') {
    (&DAT_001a117f)[sVar1] = 0;
  }
  if (acutest_test_check_count_ < 1) {
    if (1 < acutest_verbose_level_) {
      if ((acutest_test_already_logged_ == 0) && (acutest_current_test_ != (acutest_test_ *)0x0)) {
        acutest_finish_test_line_(ACUTEST_STATE_SKIPPED);
      }
      acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
      acutest_line_indent_(1);
      if (file != (char *)0x0) {
        pcVar2 = acutest_basename_(file);
        printf("%s:%d: ",pcVar2,line);
      }
      printf("%s... ",acutest_test_skip_reason_);
      acutest_colored_printf_(3,"%s","skipped");
      putchar(10);
      acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
    }
    acutest_test_skip_count_ = acutest_test_skip_count_ + 1;
  }
  else {
    acutest_check_(0,file,line,"Cannot skip, already performed some checks");
  }
  return;
}

Assistant:

acutest_skip_(const char* file, int line, const char* fmt, ...)
{
    va_list args;
    size_t reason_len;

    va_start(args, fmt);
    vsnprintf(acutest_test_skip_reason_, sizeof(acutest_test_skip_reason_), fmt, args);
    va_end(args);
    acutest_test_skip_reason_[sizeof(acutest_test_skip_reason_)-1] = '\0';

    /* Remove final dot, if provided; that collides with our other logic. */
    reason_len = strlen(acutest_test_skip_reason_);
    if(acutest_test_skip_reason_[reason_len-1] == '.')
        acutest_test_skip_reason_[reason_len-1] = '\0';

    if(acutest_test_check_count_ > 0) {
        acutest_check_(0, file, line, "Cannot skip, already performed some checks");
        return;
    }

    if(acutest_verbose_level_ >= 2) {
        const char *result_str = "skipped";
        int result_color = ACUTEST_COLOR_YELLOW_;

        if(!acutest_test_already_logged_  &&  acutest_current_test_ != NULL)
            acutest_finish_test_line_(ACUTEST_STATE_SKIPPED);
        acutest_test_already_logged_++;

        acutest_line_indent_(1);

        if(file != NULL) {
            file = acutest_basename_(file);
            printf("%s:%d: ", file, line);
        }

        printf("%s... ", acutest_test_skip_reason_);
        acutest_colored_printf_(result_color, "%s", result_str);
        printf("\n");
        acutest_test_already_logged_++;
    }

    acutest_test_skip_count_++;
}